

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::RoundScalarWithFormatT<int,int>(char *format,ImGuiDataType data_type,int v)

{
  char *fmt;
  double dVar1;
  char **local_90;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  int v_local;
  ImGuiDataType data_type_local;
  char *format_local;
  
  fmt_start._0_4_ = v;
  fmt_start._4_4_ = data_type;
  _v_local = format;
  fmt = ImParseFormatFindStart(format);
  if ((*fmt == '%') && (fmt[1] != '%')) {
    SanitizeFormatString(fmt,v_str + 0x38,0x20);
    ImFormatString((char *)&p,0x40,v_str + 0x38,(ulong)(uint)fmt_start);
    for (local_90 = &p; *(char *)local_90 == ' '; local_90 = (char **)((long)local_90 + 1)) {
    }
    if ((fmt_start._4_4_ == 8) || (fmt_start._4_4_ == 9)) {
      dVar1 = atof((char *)local_90);
      fmt_start._0_4_ = (uint)dVar1;
    }
    else {
      ImAtoi<int>((char *)local_90,(int *)&fmt_start);
    }
    format_local._4_4_ = (uint)fmt_start;
  }
  else {
    format_local._4_4_ = (uint)fmt_start;
  }
  return format_local._4_4_;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}